

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::FeatureResolverTest_CompileDefaultsMissingDescriptor_Test::
TestBody(FeatureResolverTest_CompileDefaultsMissingDescriptor_Test *this)

{
  char *message;
  AssertionResult gtest_ar;
  Edition in_stack_ffffffffffffff28;
  char local_d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1 local_c0;
  long local_b8;
  long local_b0 [6];
  AssertHelper local_80 [2];
  undefined1 local_70 [16];
  long *local_60;
  long local_58;
  long local_50 [2];
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  testing::HasSubstr<char[46]>
            (&local_40,(StringLike<char[46]> *)"find definition of google.protobuf.FeatureSet");
  local_c0 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)
             local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,local_40.impl_.substring_._M_dataplus._M_p,
             local_40.impl_.substring_._M_dataplus._M_p + local_40.impl_.substring_._M_string_length
            );
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_c0,local_b8 + (long)local_c0);
  if (local_c0 !=
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)local_b0) {
    operator_delete((void *)local_c0,local_b0[0] + 1);
  }
  local_c0 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)
             local_b0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c0,local_60,local_58 + (long)local_60);
  local_80[0].data_ = (AssertHelperData *)local_70;
  std::__cxx11::string::_M_construct<char*>((string *)local_80,local_c0,local_b8 + (long)local_c0);
  if (local_c0 !=
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)local_b0) {
    operator_delete((void *)local_c0,local_b0[0] + 1);
  }
  FeatureResolver::CompileDefaults
            ((StatusOr<google::protobuf::FeatureSetDefaults> *)&local_c0.status_,
             (FeatureResolver *)0x0,(Descriptor *)0x0,
             (Span<const_google::protobuf::FieldDescriptor_*const>)(ZEXT816(1000) << 0x40),
             EDITION_2023,in_stack_ffffffffffffff28);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::HasErrorMatcherP<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>
  ::operator()(local_d0,(char *)local_80,
               (StatusOr<google::protobuf::FeatureSetDefaults> *)
               "FeatureResolver::CompileDefaults(nullptr, {}, EDITION_2023, EDITION_2023)");
  absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
  ~StatusOrData((StatusOrData<google::protobuf::FeatureSetDefaults> *)&local_c0.status_);
  if (local_80[0].data_ != (AssertHelperData *)local_70) {
    operator_delete(local_80[0].data_,local_70._0_8_ + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.impl_.substring_._M_dataplus._M_p != &local_40.impl_.substring_.field_2) {
    operator_delete(local_40.impl_.substring_._M_dataplus._M_p,
                    local_40.impl_.substring_.field_2._M_allocated_capacity + 1);
  }
  if (local_d0[0] == '\0') {
    testing::Message::Message((Message *)&local_c0.status_);
    if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver_test.cc"
               ,0x19e,message);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_c0.status_);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    if (local_c0 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,local_c8);
  }
  return;
}

Assistant:

TEST(FeatureResolverTest, CompileDefaultsMissingDescriptor) {
  EXPECT_THAT(
      FeatureResolver::CompileDefaults(nullptr, {}, EDITION_2023, EDITION_2023),
      HasError(HasSubstr("find definition of google.protobuf.FeatureSet")));
}